

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_A_WolfAttack
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  TObjPtr<AActor> *obj;
  double dVar1;
  uint uVar2;
  PClassActor *this;
  BYTE *pBVar3;
  DAngle angle_00;
  bool bVar4;
  int iVar5;
  VMValue *pVVar6;
  AActor *pAVar7;
  AActor *pAVar8;
  PClassActor *pPVar9;
  VMValue *pVVar10;
  int iVar11;
  AActor *t1;
  int iVar12;
  char *pcVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  undefined4 uVar17;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar18;
  undefined4 extraout_XMM0_Db;
  double dVar19;
  double dVar20;
  uint local_d4;
  DAngle angle;
  FSoundID local_a8;
  FName local_a4;
  DVector3 BloodPos;
  DAngle local_70;
  AActor *local_68;
  DAngle local_60;
  DAngle local_58;
  DAngle local_50;
  DVector2 vec;
  
  if (numparam < 1) {
    pcVar13 = "(paramnum) < numparam";
    goto LAB_003eb23a;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003eb20b:
    pcVar13 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003eb23a:
    __assert_fail(pcVar13,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x14be,
                  "int AF_AActor_A_WolfAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  t1 = *(AActor **)&param->field_0;
  if ((param->field_0).field_1.atag == 1) {
    if (t1 == (AActor *)0x0) goto LAB_003eabfa;
    bVar4 = DObject::IsKindOf((DObject *)t1,AActor::RegistrationInfo.MyClass);
    if (!bVar4) {
      pcVar13 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003eb23a;
    }
  }
  else {
    if (t1 != (AActor *)0x0) goto LAB_003eb20b;
LAB_003eabfa:
    t1 = (AActor *)0x0;
  }
  if (numparam == 1) {
    pVVar6 = defaultparam->Array;
    if (pVVar6[1].field_0.field_3.Type != '\0') {
      pcVar13 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003eb325:
      __assert_fail(pcVar13,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x14bf,
                    "int AF_AActor_A_WolfAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_d4 = pVVar6[1].field_0.i;
LAB_003eac52:
    if (pVVar6[2].field_0.field_3.Type != '\0') {
      pcVar13 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003eb344:
      __assert_fail(pcVar13,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x14c0,
                    "int AF_AActor_A_WolfAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar16 = pVVar6[2].field_0.i;
LAB_003eac60:
    if (pVVar6[3].field_0.field_3.Type != '\x01') {
      pcVar13 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003eb2f4:
      __assert_fail(pcVar13,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x14c1,
                    "int AF_AActor_A_WolfAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    uVar17 = (undefined4)*(undefined8 *)&pVVar6[3].field_0;
    uVar18 = (undefined4)((ulong)*(undefined8 *)&pVVar6[3].field_0 >> 0x20);
LAB_003eac6f:
    if (pVVar6[4].field_0.field_3.Type != '\0') {
      pcVar13 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003eb2d5:
      __assert_fail(pcVar13,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x14c2,
                    "int AF_AActor_A_WolfAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar12 = pVVar6[4].field_0.i;
LAB_003eac7c:
    if (pVVar6[5].field_0.field_3.Type != '\0') {
      pcVar13 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003eb2b6:
      __assert_fail(pcVar13,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x14c3,
                    "int AF_AActor_A_WolfAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar5 = pVVar6[5].field_0.i;
LAB_003eac89:
    if (pVVar6[6].field_0.field_3.Type != '\0') {
      pcVar13 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003eb297:
      __assert_fail(pcVar13,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x14c4,
                    "int AF_AActor_A_WolfAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar14 = pVVar6[6].field_0.i;
LAB_003eac97:
    if (pVVar6[7].field_0.field_3.Type != '\0') {
      pcVar13 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003eb278:
      __assert_fail(pcVar13,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x14c5,
                    "int AF_AActor_A_WolfAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar11 = pVVar6[7].field_0.i;
LAB_003eaca4:
    if (pVVar6[8].field_0.field_3.Type != '\x01') {
      pcVar13 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003eb259:
      __assert_fail(pcVar13,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x14c6,
                    "int AF_AActor_A_WolfAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    dVar19 = pVVar6[8].field_0.f;
  }
  else {
    if (param[1].field_0.field_3.Type != '\0') {
      pcVar13 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003eb325;
    }
    local_d4 = param[1].field_0.i;
    if ((uint)numparam < 3) {
      pVVar6 = defaultparam->Array;
      goto LAB_003eac52;
    }
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar13 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003eb344;
    }
    iVar16 = param[2].field_0.i;
    if (numparam == 3) {
      pVVar6 = defaultparam->Array;
      goto LAB_003eac60;
    }
    if (param[3].field_0.field_3.Type != '\x01') {
      pcVar13 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003eb2f4;
    }
    uVar17 = (undefined4)*(undefined8 *)&param[3].field_0;
    uVar18 = (undefined4)((ulong)*(undefined8 *)&param[3].field_0 >> 0x20);
    if ((uint)numparam < 5) {
      pVVar6 = defaultparam->Array;
      goto LAB_003eac6f;
    }
    if (param[4].field_0.field_3.Type != '\0') {
      pcVar13 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003eb2d5;
    }
    iVar12 = param[4].field_0.i;
    if (numparam == 5) {
      pVVar6 = defaultparam->Array;
      goto LAB_003eac7c;
    }
    if (param[5].field_0.field_3.Type != '\0') {
      pcVar13 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003eb2b6;
    }
    iVar5 = param[5].field_0.i;
    if ((uint)numparam < 7) {
      pVVar6 = defaultparam->Array;
      goto LAB_003eac89;
    }
    if (param[6].field_0.field_3.Type != '\0') {
      pcVar13 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003eb297;
    }
    iVar14 = param[6].field_0.i;
    if (numparam == 7) {
      pVVar6 = defaultparam->Array;
      goto LAB_003eac97;
    }
    if (param[7].field_0.field_3.Type != '\0') {
      pcVar13 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003eb278;
    }
    iVar11 = param[7].field_0.i;
    if ((uint)numparam < 9) {
      pVVar6 = defaultparam->Array;
      goto LAB_003eaca4;
    }
    if (param[8].field_0.field_3.Type != '\x01') {
      pcVar13 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003eb259;
    }
    dVar19 = param[8].field_0.f;
    if (numparam != 9) {
      if ((param[9].field_0.field_3.Type != '\x03') ||
         ((pVVar10 = param + 9, param[9].field_0.field_1.atag != 1 &&
          ((pVVar10->field_0).field_1.a != (void *)0x0)))) {
        pcVar13 = 
        "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
        ;
        goto LAB_003eb21b;
      }
      goto LAB_003eace0;
    }
    pVVar6 = defaultparam->Array;
  }
  if ((pVVar6[9].field_0.field_3.Type != '\x03') ||
     ((pVVar10 = pVVar6 + 9, pVVar6[9].field_0.field_1.atag != 1 &&
      ((pVVar10->field_0).field_1.a != (void *)0x0)))) {
    pcVar13 = 
    "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
    ;
LAB_003eb21b:
    __assert_fail(pcVar13,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x14c7,
                  "int AF_AActor_A_WolfAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
LAB_003eace0:
  this = (PClassActor *)(pVVar10->field_0).field_1.a;
  obj = &t1->target;
  pAVar7 = GC::ReadBarrier<AActor>((AActor **)obj);
  if (pAVar7 != (AActor *)0x0) {
    pAVar7 = GC::ReadBarrier<AActor>((AActor **)obj);
    bVar4 = P_CheckSight(t1,pAVar7,0);
    if (bVar4) {
      A_FaceTarget(t1);
      pAVar7 = GC::ReadBarrier<AActor>((AActor **)obj);
      pAVar8 = GC::ReadBarrier<AActor>((AActor **)obj);
      AActor::AngleTo((AActor *)&BloodPos,pAVar8,SUB81(t1,0));
      dVar1 = (pAVar7->Angles).Yaw.Degrees;
      pAVar7 = GC::ReadBarrier<AActor>((AActor **)obj);
      bVar4 = P_CheckSight(pAVar7,t1,0);
      GC::ReadBarrier<AActor>((AActor **)obj);
      AActor::Vec2To((AActor *)&vec,t1);
      dVar20 = ABS(vec.X);
      if (ABS(vec.X) <= ABS(vec.Y)) {
        dVar20 = ABS(vec.Y);
      }
      dVar20 = (double)CONCAT44(uVar18,uVar17) * dVar20;
      iVar15 = (int)(dVar20 / (double)iVar5) *
               ((uint)(byte)(21.333333333333332 <=
                             ABS((double)SUB84((dVar1 - BloodPos.X) * 11930464.711111112 +
                                               6755399441055744.0,0) * 8.381903171539307e-08) |
                            ~bVar4) << 3 | 0xfffffff0);
      pAVar7 = GC::ReadBarrier<AActor>((AActor **)obj);
      dVar1 = TVector3<double>::LengthSquared(&pAVar7->Vel);
      iVar5 = iVar15 + 0x100;
      if (dVar19 <= dVar1) {
        iVar5 = iVar15 + 0xa0;
      }
      pAVar7 = GC::ReadBarrier<AActor>((AActor **)obj);
      uVar2 = (pAVar7->flags).Value;
      iVar15 = FRandom::operator()(&pr_cabullet);
      if (iVar15 < iVar5 >> ((byte)(uVar2 >> 0x11) & 2)) {
        pAVar7 = GC::ReadBarrier<AActor>((AActor **)obj);
        AActor::AngleTo((AActor *)&angle,pAVar7,SUB81(t1,0));
        pAVar7 = GC::ReadBarrier<AActor>((AActor **)obj);
        pAVar8 = GC::ReadBarrier<AActor>((AActor **)obj);
        dVar19 = pAVar8->radius;
        local_50.Degrees = angle.Degrees;
        pAVar8 = GC::ReadBarrier<AActor>((AActor **)obj);
        AActor::Vec3Angle(&BloodPos,pAVar7,dVar19,&local_50,pAVar8->Height * 0.5,false);
        if ((local_d4 & 1) == 0) {
          iVar5 = FRandom::operator()(&pr_cabullet);
          iVar12 = iVar5 % iVar12 + 1;
        }
        iVar12 = (iVar12 >> ((double)iVar14 <= dVar20)) >> ((double)iVar11 <= dVar20);
        pAVar7 = GC::ReadBarrier<AActor>((AActor **)obj);
        bVar4 = true;
        if (((pAVar7->flags).Value & 0x80000) == 0) {
          pAVar7 = GC::ReadBarrier<AActor>((AActor **)obj);
          bVar4 = ((pAVar7->flags2).Value & 0x18000000) != 0;
        }
        if (((local_d4 & 2) == 0) || (this == (PClassActor *)0x0)) {
          bVar4 = (bool)(bVar4 ^ 1);
          pAVar7 = GC::ReadBarrier<AActor>((AActor **)obj);
          iVar12 = iVar12 >> ((byte)(pAVar7->flags3).Value >> 2 & 2);
          iVar5 = 0;
        }
        else {
          pPVar9 = PClassActor::GetReplacement(this,true);
          pBVar3 = (pPVar9->super_PClass).Defaults;
          iVar5 = *(int *)(pBVar3 + 0x404);
          if (((pBVar3[0x1c1] & 0x40) != 0) &&
             (pAVar7 = GC::ReadBarrier<AActor>((AActor **)obj), ((pAVar7->flags3).Value & 8) != 0))
          {
            iVar12 = 0;
          }
          bVar4 = !bVar4;
          if (!bVar4) {
            local_58.Degrees = angle.Degrees;
            local_60.Degrees = angle.Degrees;
            P_SpawnPuff(t1,this,&BloodPos,&local_58,&local_60,0,0,(AActor *)0x0);
          }
        }
        if (iVar12 != 0) {
          pAVar7 = GC::ReadBarrier<AActor>((AActor **)obj);
          local_68 = (AActor *)0x0;
          angle_00.Degrees._4_4_ = extraout_XMM0_Db;
          angle_00.Degrees._0_4_ = extraout_XMM0_Da;
          local_a4.Index = iVar5;
          iVar5 = P_DamageMobj(pAVar7,t1,t1,iVar12,&local_a4,4,angle_00);
          if (bVar4) {
            local_70.Degrees = angle.Degrees;
            if (0 < iVar5) {
              iVar12 = iVar5;
            }
            pAVar7 = GC::ReadBarrier<AActor>((AActor **)obj);
            P_SpawnBlood(&BloodPos,&local_70,iVar12,pAVar7);
            pAVar7 = GC::ReadBarrier<AActor>((AActor **)obj);
            P_TraceBleed(iVar12,pAVar7,t1);
          }
        }
      }
      local_a8.ID = iVar16;
      S_Sound(t1,1,&local_a8,1.0,1.0);
    }
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_WolfAttack)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT_DEF	(flags)				
	PARAM_SOUND_DEF	(sound)				
	PARAM_FLOAT_DEF	(snipe)				
	PARAM_INT_DEF	(maxdamage)			
	PARAM_INT_DEF	(blocksize)			
	PARAM_INT_DEF	(pointblank)		
	PARAM_INT_DEF	(longrange)			
	PARAM_FLOAT_DEF	(runspeed)			
	PARAM_CLASS_DEF	(pufftype, AActor)	

	if (!self->target)
		return 0;

	// Enemy can't see target
	if (!P_CheckSight(self, self->target))
		return 0;

	A_FaceTarget (self);

	// Target can dodge if it can see enemy
	DAngle angle = absangle(self->target->Angles.Yaw, self->target->AngleTo(self));
	bool dodge = (P_CheckSight(self->target, self) && angle < 30. * 256. / 360.);	// 30 byteangles ~ 21�

	// Distance check is simplistic
	DVector2 vec = self->Vec2To(self->target);
	double dx = fabs (vec.X);
	double dy = fabs (vec.Y);
	double dist = dx > dy ? dx : dy;

	// Some enemies are more precise
	dist *= snipe;

	// Convert distance into integer number of blocks
	int idist = int(dist / blocksize);

	// Now for the speed accuracy thingie
	double speed = self->target->Vel.LengthSquared();
	int hitchance = speed < runspeed ? 256 : 160;

	// Distance accuracy (factoring dodge)
	hitchance -= idist * (dodge ? 16 : 8);

	// While we're here, we may as well do something for this:
	if (self->target->flags & MF_SHADOW)
	{
		hitchance >>= 2;
	}

	// The attack itself
	if (pr_cabullet() < hitchance)
	{
		// Compute position for spawning blood/puff
		DAngle angle = self->target->AngleTo(self);
		DVector3 BloodPos = self->target->Vec3Angle(self->target->radius, angle, self->target->Height/2);

		int damage = flags & WAF_NORANDOM ? maxdamage : (1 + (pr_cabullet() % maxdamage));
		if (dist >= pointblank)
			damage >>= 1;
		if (dist >= longrange)
			damage >>= 1;
		FName mod = NAME_None;
		bool spawnblood = !((self->target->flags & MF_NOBLOOD) 
			|| (self->target->flags2 & (MF2_INVULNERABLE|MF2_DORMANT)));
		if (flags & WAF_USEPUFF && pufftype)
		{
			AActor *dpuff = GetDefaultByType(pufftype->GetReplacement());
			mod = dpuff->DamageType;

			if (dpuff->flags2 & MF2_THRUGHOST && self->target->flags3 & MF3_GHOST)
				damage = 0;
			
			if ((0 && dpuff->flags3 & MF3_PUFFONACTORS) || !spawnblood)
			{
				spawnblood = false;
				P_SpawnPuff(self, pufftype, BloodPos, angle, angle, 0);
			}
		}
		else if (self->target->flags3 & MF3_GHOST)
			damage >>= 2;
		if (damage)
		{
			int newdam = P_DamageMobj(self->target, self, self, damage, mod, DMG_THRUSTLESS);
			if (spawnblood)
			{
				P_SpawnBlood(BloodPos, angle, newdam > 0 ? newdam : damage, self->target);
				P_TraceBleed(newdam > 0 ? newdam : damage, self->target, self);
			}
		}
	}

	// And finally, let's play the sound
	S_Sound (self, CHAN_WEAPON, sound, 1, ATTN_NORM);
	return 0;
}